

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O0

void __thiscall
helics::RerouteFilterOperation::setString
          (RerouteFilterOperation *this,string_view property,string_view val)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  bool bVar1;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *this_00;
  undefined8 in_RDX;
  undefined8 in_RSI;
  regex_error *re;
  handle cond;
  regex test;
  shared_guarded<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
  *in_stack_fffffffffffffe98;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  flag_type in_stack_fffffffffffffebc;
  atomic_guarded<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::mutex>
  *in_stack_fffffffffffffec0;
  size_t in_stack_fffffffffffffec8;
  basic_string_view<char,_std::char_traits<char>_> *this_01;
  char *in_stack_fffffffffffffed0;
  lock_handle<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
  local_b0 [3];
  undefined8 local_58;
  undefined8 local_50;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  undefined8 local_10;
  undefined8 local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDX;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  __x._M_str = in_stack_fffffffffffffed0;
  __x._M_len = in_stack_fffffffffffffec8;
  __y._M_len._4_4_ = in_stack_fffffffffffffebc;
  __y._M_len._0_4_ = in_stack_fffffffffffffeb8;
  __y._M_str = (char *)in_stack_fffffffffffffec0;
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
    gmlc::libguarded::atomic_guarded<std::__cxx11::string,std::mutex>::operator=
              (in_stack_fffffffffffffec0,
               (basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  }
  else {
    local_58 = local_10;
    local_50 = local_8;
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    __x_00._M_str = in_stack_fffffffffffffed0;
    __x_00._M_len = in_stack_fffffffffffffec8;
    __y_00._M_len._4_4_ = in_stack_fffffffffffffebc;
    __y_00._M_len._0_4_ = in_stack_fffffffffffffeb8;
    __y_00._M_str = (char *)in_stack_fffffffffffffec0;
    bVar1 = std::operator==(__x_00,__y_00);
    if (bVar1) {
      this_01 = &local_20;
      this_00 = (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                CLI::std::basic_string_view<char,_std::char_traits<char>_>::data(this_01);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::size(this_01);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (this_00,(char *)this_01,(size_t)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc
                );
      gmlc::libguarded::
      shared_guarded<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
      ::lock(in_stack_fffffffffffffe98);
      gmlc::libguarded::
      lock_handle<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
      ::operator->(local_b0);
      std::
      set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::emplace<std::basic_string_view<char,std::char_traits<char>>&>
                ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffec0,
                 (basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      gmlc::libguarded::
      lock_handle<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
      ::~lock_handle((lock_handle<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
                      *)0x2d924a);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                (in_stack_fffffffffffffea0);
    }
  }
  return;
}

Assistant:

void RerouteFilterOperation::setString(std::string_view property, std::string_view val)
{
    if (property == "newdestination") {
        newDest = val;
    } else if (property == "condition") {
        try {
            // this line is to verify that it is a valid regex
            auto test = std::regex(val.data(), val.size());
            auto cond = conditions.lock();
            cond->emplace(val);
        }
        catch (const std::regex_error& re) {
            std::cerr << "filter expression is not a valid Regular expression " << re.what()
                      << '\n';
            throw(helics::InvalidParameter(
                std::string("filter expression is not a valid Regular expression ") + re.what()));
        }
    }
}